

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_hex4.c
# Opt level: O1

void parse_hex4_should_parse_mixed_case(void)

{
  uint uVar1;
  
  uVar1 = parse_hex4((uchar *)"beef");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x31,0x14);
  uVar1 = parse_hex4((uchar *)"beeF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x32,0x14);
  uVar1 = parse_hex4((uchar *)"beEf");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x33,0x14);
  uVar1 = parse_hex4((uchar *)"beEF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x34,0x14);
  uVar1 = parse_hex4((uchar *)"bEef");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x35,0x14);
  uVar1 = parse_hex4((uchar *)"bEeF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x36,0x14);
  uVar1 = parse_hex4((uchar *)"bEEf");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x37,0x14);
  uVar1 = parse_hex4((uchar *)"bEEF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x38,0x14);
  uVar1 = parse_hex4((uchar *)"Beef");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x39,0x14);
  uVar1 = parse_hex4((uchar *)"BeeF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3a,0x14);
  uVar1 = parse_hex4((uchar *)"BeEf");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3b,0x14);
  uVar1 = parse_hex4((uchar *)"BeEF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3c,0x14);
  uVar1 = parse_hex4((uchar *)"BEef");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3d,0x14);
  uVar1 = parse_hex4((uchar *)"BEeF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3e,0x14);
  uVar1 = parse_hex4((uchar *)"BEEf");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x3f,0x14);
  uVar1 = parse_hex4((uchar *)"BEEF");
  UnityAssertEqualNumber(0xbeef,uVar1,0,0x40,0x14);
  return;
}

Assistant:

static void parse_hex4_should_parse_mixed_case(void)
{
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"beEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"bEEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"Beef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BeEF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEef"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEeF"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEEf"));
    TEST_ASSERT_EQUAL_INT(0xBEEF, parse_hex4((const unsigned char*)"BEEF"));
}